

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.c
# Opt level: O2

za_file * coda_za_open(char *filename,_func_void_char_ptr_varargs *error_handler)

{
  ushort uVar1;
  _func_void_char_ptr_varargs *p_Var2;
  int iVar3;
  int *piVar4;
  za_file *zf;
  code *pcVar5;
  ssize_t sVar6;
  hashtable *phVar7;
  __off_t _Var8;
  za_entry *pzVar9;
  void *__buf;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  uint uVar14;
  char *pcStack_100;
  char buffer [2];
  int local_f0 [2];
  ushort local_e8;
  ushort local_e6;
  undefined4 local_e4;
  uint local_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  uint local_d4;
  ushort local_d0;
  ushort local_cc;
  undefined4 local_ca;
  undefined4 local_c6;
  stat statbuf;
  
  iVar3 = stat(filename,(stat *)&statbuf);
  pcStack_100 = filename;
  if (iVar3 != 0) {
    piVar4 = __errno_location();
    if (*piVar4 != 2) {
      pcVar11 = strerror(*piVar4);
      (*error_handler)("could not open %s (%s)",filename,pcVar11);
      return (za_file *)0x0;
    }
    pcVar11 = "could not find %s";
LAB_00161b1c:
    (*error_handler)(pcVar11,pcStack_100);
    return (za_file *)0x0;
  }
  if ((statbuf.st_mode._1_1_ & 0x80) == 0) {
    pcVar11 = "could not open %s (not a regular file)";
    goto LAB_00161b1c;
  }
  if (statbuf.st_size < 0x16) {
    pcVar11 = "could not open %s (not a zip file)";
    goto LAB_00161b1c;
  }
  zf = (za_file *)malloc(0x30);
  if (zf == (za_file *)0x0) {
    if (error_handler == (_func_void_char_ptr_varargs *)0x0) {
      return (za_file *)0x0;
    }
    pcVar11 = "could not allocate %ld bytes";
    pcStack_100 = (char *)0x30;
    goto LAB_00161b1c;
  }
  pcVar11 = strdup(filename);
  zf->filename = pcVar11;
  if (pcVar11 == (char *)0x0) {
    free(zf);
    if (error_handler == (_func_void_char_ptr_varargs *)0x0) {
      return (za_file *)0x0;
    }
    (*error_handler)("could not duplicate string");
    return (za_file *)0x0;
  }
  zf->file_size = statbuf.st_size;
  zf->num_entries = 0;
  zf->entry = (za_entry *)0x0;
  zf->hash_data = (hashtable *)0x0;
  pcVar5 = default_error_handler;
  if (error_handler != (_func_void_char_ptr_varargs *)0x0) {
    pcVar5 = error_handler;
  }
  zf->handle_error = pcVar5;
  iVar3 = open(filename,0);
  zf->fd = iVar3;
  if (iVar3 < 0) {
    p_Var2 = zf->handle_error;
    piVar4 = __errno_location();
    pcVar11 = strerror(*piVar4);
    (*p_Var2)("could not open file \'%s\' (%s)\n",filename,pcVar11);
    free(zf->filename);
    free(zf);
    return (za_file *)0x0;
  }
  sVar6 = read(iVar3,buffer,2);
  if (-1 < sVar6) {
    if ((buffer[0] != 'P') || (buffer[1] != 'K')) {
      (*error_handler)("could not open %s (not a zip file)",filename);
      goto LAB_00161e8a;
    }
    phVar7 = coda_hashtable_new(1);
    zf->hash_data = phVar7;
    _Var8 = lseek(zf->fd,-0x16,2);
    if ((-1 < _Var8) && (sVar6 = read(zf->fd,local_f0,0x16), -1 < sVar6)) {
      if (local_f0[0] == 0x6054b50) {
        uVar13 = (ulong)local_e0;
        zf->num_entries = (uint)local_e8;
        pcVar11 = (char *)((ulong)local_e8 * 0x38);
        pzVar9 = (za_entry *)malloc((size_t)pcVar11);
        zf->entry = pzVar9;
        if (pzVar9 != (za_entry *)0x0) {
          for (lVar10 = 0; (long)pcVar11 - lVar10 != 0; lVar10 = lVar10 + 0x38) {
            *(undefined8 *)((long)&pzVar9->filename + lVar10) = 0;
            *(za_file **)((long)&pzVar9->zf + lVar10) = zf;
          }
          _Var8 = lseek(zf->fd,uVar13,0);
          if (-1 < _Var8) {
            lVar10 = 0;
            do {
              if ((long)pcVar11 - lVar10 == 0) {
                return zf;
              }
              pzVar9 = zf->entry;
              sVar6 = read(zf->fd,local_f0,0x2e);
              if (sVar6 < 0) break;
              if (sVar6 != 0x2e) {
LAB_00161eaa:
                lVar10 = *(long *)((long)&pzVar9->zf + lVar10);
                pcVar11 = "unexpected end in zip file";
                goto LAB_00161f33;
              }
              if (local_f0[0] != 0x2014b50) {
                pcVar11 = zf->filename;
                pcVar12 = "invalid file header signature in zip file \'%s\'";
                goto LAB_00161ea3;
              }
              *(ushort *)((long)&pzVar9->compression + lVar10) = local_e6;
              if ((local_e6 & 0xfff7) != 0) {
                pcVar11 = zf->filename;
                pcVar12 = "unsupported compression for entry in zip file \'%s\'";
                goto LAB_00161ea3;
              }
              *(undefined4 *)((long)&pzVar9->modification_time + lVar10) = local_e4;
              *(ulong *)((long)&pzVar9->crc + lVar10) = CONCAT44(uStack_dc,local_e0);
              *(undefined4 *)((long)&pzVar9->uncompressed_size + lVar10) = local_d8;
              *(uint *)((long)&pzVar9->filename_length + lVar10) = local_d4;
              uVar13 = (ulong)local_d0;
              *(uint *)((long)&pzVar9->ascii + lVar10) = local_cc & 1;
              *(undefined4 *)((long)&pzVar9->attributes + lVar10) = local_ca;
              *(undefined4 *)((long)&pzVar9->localheader_offset + lVar10) = local_c6;
              uVar14 = local_d4 & 0xffff;
              __buf = malloc((ulong)uVar14 + 1);
              *(void **)((long)&pzVar9->filename + lVar10) = __buf;
              if (__buf == (void *)0x0) {
                (*zf->handle_error)("could not allocate %d bytes",(ulong)(uVar14 + 1));
                goto LAB_00161e8a;
              }
              sVar6 = read(zf->fd,__buf,(ulong)uVar14);
              if (sVar6 < 0) break;
              uVar1 = *(ushort *)((long)&pzVar9->filename_length + lVar10);
              if ((uint)sVar6 != (uint)uVar1) goto LAB_00161eaa;
              *(undefined1 *)(*(long *)((long)&pzVar9->filename + lVar10) + (ulong)uVar1) = 0;
              iVar3 = coda_hashtable_add_name
                                (zf->hash_data,*(char **)((long)&pzVar9->filename + lVar10));
              if (iVar3 != 0) {
                (*zf->handle_error)("zip file \'%s\' contains two entries with the same name \'%s\'"
                                    ,zf->filename,*(undefined8 *)((long)&pzVar9->filename + lVar10))
                ;
                goto LAB_00161e8a;
              }
              _Var8 = lseek(zf->fd,*(ushort *)((long)&pzVar9->extrafield_length + lVar10) + uVar13,1
                           );
              if (_Var8 < 0) break;
              uVar14 = *(uint *)((long)&pzVar9->localheader_offset + lVar10);
              uVar13 = zf->file_size;
              if ((long)uVar13 < (long)(ulong)uVar14) {
                lVar10 = *(long *)((long)&pzVar9->zf + lVar10);
                pcVar11 = "invalid zip file (local header offset exceeds file size)";
LAB_00161f33:
                (**(code **)(lVar10 + 0x28))(pcVar11);
                goto LAB_00161e8a;
              }
              iVar3 = *(int *)((long)&pzVar9->compressed_size + lVar10);
              if (*(short *)((long)&pzVar9->compression + lVar10) == 0) {
                if (iVar3 == *(int *)((long)&pzVar9->uncompressed_size + lVar10)) {
                  if (iVar3 + uVar14 <= uVar13) goto LAB_00161e69;
                  goto LAB_00161efe;
                }
                lVar10 = *(long *)((long)&pzVar9->zf + lVar10);
                pcVar11 = 
                "invalid zip file (compressed and uncompressed sizes should be equal for uncompressed entry)"
                ;
                goto LAB_00161f33;
              }
              if (uVar13 < uVar14 + iVar3) {
LAB_00161efe:
                lVar10 = *(long *)((long)&pzVar9->zf + lVar10);
                pcVar11 = "invalid zip file (entry size exceeds file size)";
                goto LAB_00161f33;
              }
              if (iVar3 + 1U < *(uint *)((long)&pzVar9->uncompressed_size + lVar10) / 0x408) {
                lVar10 = *(long *)((long)&pzVar9->zf + lVar10);
                pcVar11 = "invalid uncompressed size in zip file";
                goto LAB_00161f33;
              }
LAB_00161e69:
              lVar10 = lVar10 + 0x38;
            } while( true );
          }
          goto LAB_00161e72;
        }
        pcVar12 = "could not allocate %ld bytes";
      }
      else {
        pcVar11 = zf->filename;
        pcVar12 = 
        "could not locate package index in zip file \'%s\'. There is probably a \'zip file comment\' at the end of the file (which is not supported)"
        ;
      }
LAB_00161ea3:
      (*zf->handle_error)(pcVar12,pcVar11);
      goto LAB_00161e8a;
    }
  }
LAB_00161e72:
  p_Var2 = zf->handle_error;
  piVar4 = __errno_location();
  pcVar11 = strerror(*piVar4);
  (*p_Var2)(pcVar11);
LAB_00161e8a:
  coda_za_close(zf);
  return (za_file *)0x0;
}

Assistant:

za_file *za_open(const char *filename, void (*error_handler)(const char *, ...))
{
    struct stat statbuf;
    za_file *zf;
    char buffer[2];
    int open_flags;

    if (stat(filename, &statbuf) != 0)
    {
        if (errno == ENOENT)
        {
            error_handler("could not find %s", filename);
        }
        else
        {
            error_handler("could not open %s (%s)", filename, strerror(errno));
        }
        return NULL;
    }
    if ((statbuf.st_mode & S_IFREG) == 0)
    {
        error_handler("could not open %s (not a regular file)", filename);
        return NULL;
    }
    if (statbuf.st_size < 22)
    {
        error_handler("could not open %s (not a zip file)", filename);
        return NULL;
    }

    zf = malloc(sizeof(za_file));
    if (zf == NULL)
    {
        if (error_handler != NULL)
        {
            error_handler("could not allocate %ld bytes", sizeof(za_file));
        }
        return NULL;
    }
    zf->filename = strdup(filename);
    if (zf->filename == NULL)
    {
        free(zf);
        if (error_handler != NULL)
        {
            error_handler("could not duplicate string");
        }
        return NULL;
    }
    zf->file_size = statbuf.st_size;
    zf->num_entries = 0;
    zf->entry = NULL;
    zf->hash_data = NULL;
    if (error_handler != NULL)
    {
        zf->handle_error = error_handler;
    }
    else
    {
        zf->handle_error = default_error_handler;
    }

    open_flags = O_RDONLY;
#ifdef WIN32
    open_flags |= _O_BINARY;
#endif
    zf->fd = open(filename, open_flags);
    if (zf->fd < 0)
    {
        zf->handle_error("could not open file '%s' (%s)\n", filename, strerror(errno));
        free(zf->filename);
        free(zf);
        return NULL;
    }

    if (read(zf->fd, buffer, 2) < 0)
    {
        zf->handle_error(strerror(errno));
        za_close(zf);
        return NULL;
    }
    if (buffer[0] != 'P' || buffer[1] != 'K')
    {
        error_handler("could not open %s (not a zip file)", filename);
        za_close(zf);
        return NULL;
    }

    zf->hash_data = hashtable_new(1);
    if (get_entries(zf) != 0)
    {
        za_close(zf);
        return NULL;
    }

    return zf;
}